

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_pri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  REF_INT RVar14;
  REF_INT cell;
  REF_INT local [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar13 = "create";
    uVar9 = 0x25a;
    goto LAB_00120cce;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 0;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar10 = 0;
  iVar5 = (int)(5 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (5 < iVar11) {
    iVar10 = ((((iVar6 + 5) / iVar6) * (iVar11 + -6)) / iVar5 - iVar11) + 6;
  }
  if (iVar7 == iVar10) {
LAB_0012060c:
    uVar4 = ref_node_add(ref_node,0,local);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x272;
      goto LAB_00120cce;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[0];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_node_add(ref_node,1,local + 1);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x273;
      goto LAB_00120cce;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local[1];
    pRVar2 = pRVar3 + lVar12 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_node_add(ref_node,2,local + 2);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x274;
      goto LAB_00120cce;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[2];
    pRVar2[lVar12 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar12 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_node_add(ref_node,3,local + 3);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x275;
      goto LAB_00120cce;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[3];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_node_add(ref_node,4,local + 4);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x276;
      goto LAB_00120cce;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local[4];
    pRVar2 = pRVar3 + lVar12 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[4] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_node_add(ref_node,5,local + 5);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar9 = 0x277;
      goto LAB_00120cce;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[5];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[5] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar14 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar14 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar14;
    uVar4 = ref_cell_add(pRVar1->cell[10],local,&cell);
    if (uVar4 != 0) {
      pcVar13 = "add prism";
      uVar9 = 0x279;
      goto LAB_00120cce;
    }
  }
  else {
    iVar6 = (iVar6 + 5) / iVar6;
    iVar10 = 0;
    if (iVar6 + 1U < 3) {
      iVar10 = iVar6;
    }
    iVar11 = 6 - iVar11;
    if (iVar11 <= iVar10) {
      iVar10 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar10) goto LAB_0012060c;
    iVar10 = (int)(2 / (long)iVar6);
    if (iVar11 <= iVar10) {
      iVar10 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar10) goto LAB_0012060c;
    iVar10 = (int)(3 / (long)iVar6);
    if (iVar11 <= iVar10) {
      iVar10 = (3 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar10) goto LAB_0012060c;
    iVar10 = (int)(4 / (long)iVar6);
    if (iVar11 <= iVar10) {
      iVar10 = (4 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar10) goto LAB_0012060c;
    iVar10 = (int)(5 / (long)iVar6);
    if (iVar11 <= iVar10) {
      iVar10 = (5 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar10) goto LAB_0012060c;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,6);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar13 = "init glob";
  uVar9 = 0x27c;
LAB_00120cce:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_pri_grid",(ulong)uVar4,pcVar13);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 6;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_FALSE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 0.0, 1.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);
    add_that_node(4, 0.0, 1.0, 1.0);
    add_that_node(5, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}